

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerators::InitializeAutogenTarget(cmQtAutoGenerators *this,cmTarget *target)

{
  cmMakefile *this_00;
  cmSourceFile *this_01;
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  cmGlobalGenerator *pcVar4;
  cmTarget *this_02;
  cmState *pcVar5;
  cmQtAutoGenerators *this_03;
  pointer ppcVar6;
  string tools;
  string absFile;
  string workingDirectory;
  string autogenTargetName;
  string autogenComment;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  toolNames;
  string targetDir;
  cmCustomCommandLine currentLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rcc_output;
  string qtMajorVersion;
  string rcc_output_dir;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcFiles;
  string ext;
  cmCustomCommandLines commandLines;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string rcc_output_file;
  string basename;
  string local_70;
  string local_50;
  
  this_00 = target->Makefile;
  std::__cxx11::string::string
            ((string *)&autogenTargetName,"QT_VERSION_MAJOR",(allocator *)&targetDir);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&autogenTargetName);
  std::__cxx11::string::string((string *)&qtMajorVersion,pcVar2,(allocator *)&workingDirectory);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  bVar1 = std::operator==(&qtMajorVersion,"");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&autogenTargetName,"Qt5Core_VERSION_MAJOR",(allocator *)&targetDir);
    cmMakefile::GetSafeDefinition(this_00,&autogenTargetName);
    std::__cxx11::string::assign((char *)&qtMajorVersion);
    std::__cxx11::string::~string((string *)&autogenTargetName);
  }
  bVar1 = std::operator!=(&qtMajorVersion,"4");
  if (bVar1) {
    bVar1 = std::operator!=(&qtMajorVersion,"5");
    if (bVar1) {
      bVar1 = false;
      goto LAB_00349972;
    }
  }
  std::__cxx11::string::string((string *)&autogenTargetName,"AUTOMOC",(allocator *)&targetDir);
  bVar1 = cmTarget::GetPropertyAsBool(target,&autogenTargetName);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  if (bVar1) {
    getAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
    pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&targetDir,pcVar2,(allocator *)&workingDirectory);
    std::__cxx11::string::append((char *)&targetDir);
    std::__cxx11::string::append((string *)&targetDir);
    std::__cxx11::string::append((char *)&targetDir);
    cmMakefile::GetOrCreateSource(this_00,&targetDir,true);
    std::__cxx11::string::string
              ((string *)&workingDirectory,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator *)&tools);
    cmMakefile::AppendProperty(this_00,&workingDirectory,targetDir._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&workingDirectory);
    cmTarget::AddSource(target,&targetDir);
    std::__cxx11::string::~string((string *)&targetDir);
    std::__cxx11::string::~string((string *)&autogenTargetName);
  }
  getAutogenTargetName_abi_cxx11_(&autogenTargetName,target);
  getAutogenTargetDir_abi_cxx11_(&targetDir,target);
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  currentLine.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,psVar3);
  std::__cxx11::string::string((string *)&workingDirectory,"-E",(allocator *)&tools);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &workingDirectory);
  std::__cxx11::string::~string((string *)&workingDirectory);
  std::__cxx11::string::string((string *)&workingDirectory,"cmake_autogen",(allocator *)&tools);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &workingDirectory);
  std::__cxx11::string::~string((string *)&workingDirectory);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&currentLine.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&targetDir);
  std::__cxx11::string::string((string *)&workingDirectory,"$<CONFIGURATION>",(allocator *)&tools);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&currentLine,
             &workingDirectory);
  std::__cxx11::string::~string((string *)&workingDirectory);
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
  super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
             &currentLine);
  std::__cxx11::string::string((string *)&tools,"",(allocator *)&autogenComment);
  pcVar2 = cmMakefile::GetCurrentBinaryDirectory(this_00);
  cmsys::SystemTools::CollapseFullPath(&workingDirectory,&tools,pcVar2);
  std::__cxx11::string::~string((string *)&tools);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&tools,"AUTOGEN_TARGET_DEPENDS",(allocator *)&autogenComment);
  pcVar2 = cmTarget::GetProperty(target,&tools);
  std::__cxx11::string::~string((string *)&tools);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&tools,pcVar2,(allocator *)&autogenComment);
    cmSystemTools::ExpandListArgument(&tools,&depends,false);
    std::__cxx11::string::~string((string *)&tools);
  }
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  toolNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&tools,"AUTOMOC",(allocator *)&autogenComment);
  bVar1 = cmTarget::GetPropertyAsBool(target,&tools);
  std::__cxx11::string::~string((string *)&tools);
  if (bVar1) {
    std::__cxx11::string::string((string *)&tools,"moc",(allocator *)&autogenComment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
               &tools);
    std::__cxx11::string::~string((string *)&tools);
  }
  std::__cxx11::string::string((string *)&tools,"AUTOUIC",(allocator *)&autogenComment);
  bVar1 = cmTarget::GetPropertyAsBool(target,&tools);
  std::__cxx11::string::~string((string *)&tools);
  if (bVar1) {
    std::__cxx11::string::string((string *)&tools,"uic",(allocator *)&autogenComment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
               &tools);
    std::__cxx11::string::~string((string *)&tools);
  }
  std::__cxx11::string::string((string *)&tools,"AUTORCC",(allocator *)&autogenComment);
  bVar1 = cmTarget::GetPropertyAsBool(target,&tools);
  std::__cxx11::string::~string((string *)&tools);
  if (bVar1) {
    std::__cxx11::string::string((string *)&tools,"rcc",(allocator *)&autogenComment);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&toolNames,
               &tools);
    std::__cxx11::string::~string((string *)&tools);
  }
  std::__cxx11::string::string
            ((string *)&tools,
             (string *)
             toolNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&toolNames,
          (const_iterator)
          toolNames.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start);
  while( true ) {
    if ((ulong)((long)toolNames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)toolNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) break;
    std::operator+(&autogenComment,", ",
                   toolNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::append((string *)&tools);
    std::__cxx11::string::~string((string *)&autogenComment);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(&toolNames,
            (const_iterator)
            toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((long)toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)toolNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x20) {
    std::operator+(&autogenComment," and ",
                   toolNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::append((string *)&tools);
    std::__cxx11::string::~string((string *)&autogenComment);
  }
  std::operator+(&absFile,"Automatic ",&tools);
  std::operator+(&autogenComment,&absFile," for target ");
  std::__cxx11::string::~string((string *)&absFile);
  std::__cxx11::string::append((string *)&autogenComment);
  rcc_output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  rcc_output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  rcc_output.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar4 = cmMakefile::GetGlobalGenerator(this_00);
  (*pcVar4->_vptr_cmGlobalGenerator[2])(&absFile,pcVar4);
  bVar1 = std::operator==(&absFile,"Ninja");
  std::__cxx11::string::~string((string *)&absFile);
  if (bVar1) {
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmTarget::GetConfigCommonSourceFiles(target,&srcFiles);
    for (ppcVar6 = srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar6 !=
        srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
      this_01 = *ppcVar6;
      psVar3 = cmSourceFile::GetFullPath(this_01,(string *)0x0);
      cmsys::SystemTools::GetRealPath(&absFile,psVar3,(string *)0x0);
      psVar3 = cmSourceFile::GetExtension_abi_cxx11_(this_01);
      std::__cxx11::string::string((string *)&ext,(string *)psVar3);
      std::__cxx11::string::string((string *)&basename,"AUTORCC",(allocator *)&rcc_output_dir);
      bVar1 = cmTarget::GetPropertyAsBool(target,&basename);
      std::__cxx11::string::~string((string *)&basename);
      if (bVar1) {
        bVar1 = std::operator==(&ext,"qrc");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&basename,"SKIP_AUTORCC",(allocator *)&rcc_output_dir);
          pcVar2 = cmSourceFile::GetPropertyForUser(this_01,&basename);
          bVar1 = cmSystemTools::IsOn(pcVar2);
          std::__cxx11::string::~string((string *)&basename);
          if (!bVar1) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&basename,&absFile);
            cmTarget::GetSupportDirectory_abi_cxx11_(&rcc_output_dir,target);
            cmsys::SystemTools::MakeDirectory(rcc_output_dir._M_dataplus._M_p);
            std::__cxx11::string::string((string *)&rcc_output_file,(string *)&rcc_output_dir);
            std::operator+(&local_d0,"/qrc_",&basename);
            std::operator+(&local_f0,&local_d0,".cpp");
            std::__cxx11::string::append((string *)&rcc_output_file);
            std::__cxx11::string::~string((string *)&local_f0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&rcc_output,&rcc_output_file);
            std::__cxx11::string::string((string *)&local_f0,"GENERATED",(allocator *)&local_d0);
            pcVar2 = cmSourceFile::GetPropertyForUser(this_01,&local_f0);
            bVar1 = cmSystemTools::IsOn(pcVar2);
            std::__cxx11::string::~string((string *)&local_f0);
            if (!bVar1) {
              this_03 = (cmQtAutoGenerators *)0x56e6ba;
              bVar1 = std::operator==(&qtMajorVersion,"5");
              if (bVar1) {
                psVar3 = &local_50;
                ListQt5RccInputs(psVar3,this,this_01,target,&depends);
              }
              else {
                psVar3 = &local_70;
                ListQt4RccInputs(psVar3,this_03,this_01,&depends);
              }
              std::__cxx11::string::~string((string *)psVar3);
            }
            std::__cxx11::string::~string((string *)&rcc_output_file);
            std::__cxx11::string::~string((string *)&rcc_output_dir);
            std::__cxx11::string::~string((string *)&basename);
          }
        }
      }
      std::__cxx11::string::~string((string *)&ext);
      std::__cxx11::string::~string((string *)&absFile);
    }
    std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
              (&srcFiles.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  }
  this_02 = cmMakefile::AddUtilityCommand
                      (this_00,&autogenTargetName,true,workingDirectory._M_dataplus._M_p,&rcc_output
                       ,&depends,&commandLines,false,autogenComment._M_dataplus._M_p,false);
  pcVar5 = cmMakefile::GetState(this_00);
  std::__cxx11::string::string((string *)&absFile,"AUTOMOC_TARGETS_FOLDER",(allocator *)&ext);
  pcVar2 = cmState::GetGlobalProperty(pcVar5,&absFile);
  std::__cxx11::string::~string((string *)&absFile);
  if (pcVar2 == (char *)0x0) {
    pcVar5 = cmMakefile::GetState(this_00);
    std::__cxx11::string::string((string *)&absFile,"AUTOGEN_TARGETS_FOLDER",(allocator *)&ext);
    pcVar2 = cmState::GetGlobalProperty(pcVar5,&absFile);
    std::__cxx11::string::~string((string *)&absFile);
    if (pcVar2 != (char *)0x0) goto LAB_00349872;
LAB_003498a3:
    std::__cxx11::string::string((string *)&absFile,"FOLDER",(allocator *)&ext);
    pcVar2 = cmTarget::GetProperty(target,&absFile);
    if (pcVar2 != (char *)0x0) {
      cmTarget::SetProperty(this_02,&absFile,pcVar2);
    }
  }
  else {
LAB_00349872:
    if (*pcVar2 == '\0') goto LAB_003498a3;
    std::__cxx11::string::string((string *)&absFile,"FOLDER",(allocator *)&ext);
    cmTarget::SetProperty(this_02,&absFile,pcVar2);
  }
  std::__cxx11::string::~string((string *)&absFile);
  cmTarget::AddUtility(target,&autogenTargetName,(cmMakefile *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rcc_output);
  std::__cxx11::string::~string((string *)&autogenComment);
  std::__cxx11::string::~string((string *)&tools);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&toolNames);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::__cxx11::string::~string((string *)&workingDirectory);
  std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
            (&commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&currentLine.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  std::__cxx11::string::~string((string *)&targetDir);
  std::__cxx11::string::~string((string *)&autogenTargetName);
  bVar1 = true;
LAB_00349972:
  std::__cxx11::string::~string((string *)&qtMajorVersion);
  return bVar1;
}

Assistant:

bool cmQtAutoGenerators::InitializeAutogenTarget(cmTarget* target)
{
  cmMakefile* makefile = target->GetMakefile();
  // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
  std::string qtMajorVersion = makefile->GetSafeDefinition("QT_VERSION_MAJOR");
  if (qtMajorVersion == "")
    {
    qtMajorVersion = makefile->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
    }
  if (qtMajorVersion != "4" && qtMajorVersion != "5")
    {
    return false;
    }

  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    std::string automocTargetName = getAutogenTargetName(target);
    std::string mocCppFile = makefile->GetCurrentBinaryDirectory();
    mocCppFile += "/";
    mocCppFile += automocTargetName;
    mocCppFile += ".cpp";
    makefile->GetOrCreateSource(mocCppFile, true);
    makefile->AppendProperty("ADDITIONAL_MAKE_CLEAN_FILES",
                            mocCppFile.c_str(), false);

    target->AddSource(mocCppFile);
    }
  // create a custom target for running generators at buildtime:
  std::string autogenTargetName = getAutogenTargetName(target);

  std::string targetDir = getAutogenTargetDir(target);

  cmCustomCommandLine currentLine;
  currentLine.push_back(cmSystemTools::GetCMakeCommand());
  currentLine.push_back("-E");
  currentLine.push_back("cmake_autogen");
  currentLine.push_back(targetDir);
  currentLine.push_back("$<CONFIGURATION>");

  cmCustomCommandLines commandLines;
  commandLines.push_back(currentLine);

  std::string workingDirectory = cmSystemTools::CollapseFullPath(
                                    "", makefile->GetCurrentBinaryDirectory());

  std::vector<std::string> depends;
  if (const char *autogenDepends =
                                target->GetProperty("AUTOGEN_TARGET_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(autogenDepends, depends);
    }
  std::vector<std::string> toolNames;
  if (target->GetPropertyAsBool("AUTOMOC"))
    {
    toolNames.push_back("moc");
    }
  if (target->GetPropertyAsBool("AUTOUIC"))
    {
    toolNames.push_back("uic");
    }
  if (target->GetPropertyAsBool("AUTORCC"))
    {
    toolNames.push_back("rcc");
    }

  std::string tools = toolNames[0];
  toolNames.erase(toolNames.begin());
  while (toolNames.size() > 1)
    {
    tools += ", " + toolNames[0];
    toolNames.erase(toolNames.begin());
    }
  if (toolNames.size() == 1)
    {
    tools += " and " + toolNames[0];
    }
  std::string autogenComment = "Automatic " + tools + " for target ";
  autogenComment += target->GetName();

#if defined(_WIN32) && !defined(__CYGWIN__)
  bool usePRE_BUILD = false;
  cmGlobalGenerator* gg = makefile->GetGlobalGenerator();
  if(gg->GetName().find("Visual Studio") != std::string::npos)
    {
    cmGlobalVisualStudioGenerator* vsgg =
      static_cast<cmGlobalVisualStudioGenerator*>(gg);
    // Under VS >= 7 use a PRE_BUILD event instead of a separate target to
    // reduce the number of targets loaded into the IDE.
    // This also works around a VS 11 bug that may skip updating the target:
    //  https://connect.microsoft.com/VisualStudio/feedback/details/769495
    usePRE_BUILD = vsgg->GetVersion() >= cmGlobalVisualStudioGenerator::VS7;
    if(usePRE_BUILD)
      {
      for (std::vector<std::string>::iterator it = depends.begin();
            it != depends.end(); ++it)
        {
        if(!makefile->FindTargetToUse(it->c_str()))
          {
          usePRE_BUILD = false;
          break;
          }
        }
      }
    }
#endif

  std::vector<std::string> rcc_output;
  bool const isNinja =
    makefile->GetGlobalGenerator()->GetName() == "Ninja";
  if(isNinja
#if defined(_WIN32) && !defined(__CYGWIN__)
        || usePRE_BUILD
#endif
        )
    {
    std::vector<cmSourceFile*> srcFiles;
    target->GetConfigCommonSourceFiles(srcFiles);
    for(std::vector<cmSourceFile*>::const_iterator fileIt = srcFiles.begin();
        fileIt != srcFiles.end();
        ++fileIt)
      {
      cmSourceFile* sf = *fileIt;
      std::string absFile = cmsys::SystemTools::GetRealPath(
                                                sf->GetFullPath());

      std::string ext = sf->GetExtension();

      if (target->GetPropertyAsBool("AUTORCC"))
        {
        if (ext == "qrc"
            && !cmSystemTools::IsOn(sf->GetPropertyForUser("SKIP_AUTORCC")))
          {
          std::string basename = cmsys::SystemTools::
                                  GetFilenameWithoutLastExtension(absFile);

          std::string rcc_output_dir = target->GetSupportDirectory();
          cmSystemTools::MakeDirectory(rcc_output_dir.c_str());
          std::string rcc_output_file = rcc_output_dir;
          rcc_output_file += "/qrc_" + basename + ".cpp";
          rcc_output.push_back(rcc_output_file);

          if (!cmSystemTools::IsOn(sf->GetPropertyForUser("GENERATED")))
            {
            if (qtMajorVersion == "5")
              {
              this->ListQt5RccInputs(sf, target, depends);
              }
            else
              {
              this->ListQt4RccInputs(sf, depends);
              }
#if defined(_WIN32) && !defined(__CYGWIN__)
            // Cannot use PRE_BUILD because the resource files themselves
            // may not be sources within the target so VS may not know the
            // target needs to re-build at all.
            usePRE_BUILD = false;
#endif
            }
          }
        }
      }
    }

#if defined(_WIN32) && !defined(__CYGWIN__)
  if(usePRE_BUILD)
    {
    // Add the pre-build command directly to bypass the OBJECT_LIBRARY
    // rejection in cmMakefile::AddCustomCommandToTarget because we know
    // PRE_BUILD will work for an OBJECT_LIBRARY in this specific case.
    std::vector<std::string> no_output;
    std::vector<std::string> no_byproducts;
    cmCustomCommand cc(makefile, no_output, no_byproducts, depends,
                       commandLines, autogenComment.c_str(),
                       workingDirectory.c_str());
    cc.SetEscapeOldStyle(false);
    cc.SetEscapeAllowMakeVars(true);
    target->AddPreBuildCommand(cc);
    }
  else
#endif
    {
    cmTarget* autogenTarget = makefile->AddUtilityCommand(
                                autogenTargetName, true,
                                workingDirectory.c_str(),
                                /*byproducts=*/rcc_output, depends,
                                commandLines, false, autogenComment.c_str());

    // Set target folder
    const char* autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (!autogenFolder)
      {
      autogenFolder = makefile->GetState()
                                ->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      }
    if (autogenFolder && *autogenFolder)
      {
      autogenTarget->SetProperty("FOLDER", autogenFolder);
      }
    else
      {
      // inherit FOLDER property from target (#13688)
      copyTargetProperty(autogenTarget, target, "FOLDER");
      }

    target->AddUtility(autogenTargetName);
    }

  return true;
}